

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O1

void run_negation_range_inplace_test4(void)

{
  _Bool unaff_retaddr;
  
  run_negation_range_tests(1000,999,0,0,2,1,false,unaff_retaddr);
  return;
}

Assistant:

DEFINE_TEST(run_negation_range_inplace_test4) {
    // runs of length 999 begin every 1000 starting
    // at 0.
    // last run starts at 65000 hence we end in a
    // run
    // negation over whole range.
    // Result should be array

    run_negation_range_tests(1000, 999, 0, 0x0000, 0x10000,
                             ARRAY_CONTAINER_TYPE, true,
                             false);  // request but don't get inplace
}